

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

uint AttributeVersions(Node *node,AttVal *attval)

{
  AttrVersion *pAVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  if (attval != (AttVal *)0x0) {
    if ((attval->attribute != (ctmbstr)0x0) &&
       (iVar3 = prvTidytmbstrncmp(attval->attribute,"data-",5), iVar3 == 0)) {
      return 0x60000;
    }
    uVar4 = 0;
    if ((((attval->dict != (Attribute *)0x0) && (uVar4 = 0xe000, node != (Node *)0x0)) &&
        (node->tag != (Dict *)0x0)) && (pAVar1 = node->tag->attrvers, pAVar1 != (AttrVersion *)0x0))
    {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (pAVar1[uVar5].attribute == TidyAttr_UNKNOWN) {
          return 0xe000;
        }
        uVar2 = (ulong)((int)uVar5 + 1);
      } while (pAVar1[uVar5].attribute != attval->dict->id);
      uVar4 = pAVar1[uVar5].versions;
    }
  }
  return uVar4;
}

Assistant:

static uint AttributeVersions(Node* node, AttVal* attval)
{
    uint i;

    /* Override or add to items in attrdict.c */
    if (attval && attval->attribute) {
        /* HTML5 data-* attributes can't be added generically; handle here. */
        if (TY_(tmbstrncmp)(attval->attribute, "data-", 5) == 0)
            return (XH50 | HT50);
    }
    /* TODO: maybe this should return VERS_PROPRIETARY instead? */
    if (!attval || !attval->dict)
        return VERS_UNKNOWN;

    if (!(!node || !node->tag || !node->tag->attrvers))
        for (i = 0; node->tag->attrvers[i].attribute; ++i)
            if (node->tag->attrvers[i].attribute == attval->dict->id)
                return node->tag->attrvers[i].versions;

    return VERS_PROPRIETARY;
}